

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

BaseNode * __thiscall asmjit::BaseBuilder::removeNode(BaseBuilder *this,BaseNode *node)

{
  uint8_t *puVar1;
  BaseNode *pBVar2;
  BaseNode *pBVar3;
  BaseNode *pBVar4;
  BaseNode **ppBVar5;
  
  if ((char)(node->field_1)._any._nodeFlags < '\0') {
    pBVar2 = (node->field_0).field_0._prev;
    pBVar3 = (node->field_0).field_0._next;
    ppBVar5 = &(pBVar2->field_0).field_0._next;
    if (this->_firstNode == node) {
      ppBVar5 = &this->_firstNode;
    }
    *ppBVar5 = pBVar3;
    pBVar4 = (BaseNode *)&this->_lastNode;
    if (this->_lastNode != node) {
      pBVar4 = pBVar3;
    }
    (pBVar4->field_0).field_0._prev = pBVar2;
    (node->field_0).field_0._prev = (BaseNode *)0x0;
    (node->field_0).field_0._next = (BaseNode *)0x0;
    puVar1 = &(node->field_1)._any._nodeFlags;
    *puVar1 = *puVar1 & 0x7f;
    if ((node->field_1)._any._nodeType == '\x02') {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar2;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::removeNode(BaseNode* node) noexcept {
  if (!node->isActive())
    return node;

  BaseNode* prev = node->prev();
  BaseNode* next = node->next();

  if (_firstNode == node)
    _firstNode = next;
  else
    prev->_next = next;

  if (_lastNode == node)
    _lastNode  = prev;
  else
    next->_prev = prev;

  node->_prev = nullptr;
  node->_next = nullptr;
  node->clearFlags(BaseNode::kFlagIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  if (_cursor == node)
    _cursor = prev;

  return node;
}